

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void object_suite::fail_one_mismatched(void)

{
  error_code eVar1;
  undefined4 local_234;
  int local_230 [2];
  error_category *local_228;
  undefined4 local_218;
  value local_214;
  undefined1 local_20f;
  undefined1 local_20e [2];
  undefined4 local_20c;
  size_type local_208;
  undefined4 local_1fc;
  int local_1f8 [2];
  undefined4 local_1f0;
  value local_1ec;
  undefined1 local_1e7;
  undefined1 local_1e6 [2];
  undefined4 local_1e4;
  size_type local_1e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined4 local_1a8;
  value local_1a4;
  undefined1 local_19f;
  undefined1 local_19e [2];
  undefined4 local_19c;
  size_type local_198 [3];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [12];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x226168706c61227b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x38d,"void object_suite::fail_one_mismatched()",local_178,&local_17c);
  local_198[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_19c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x38e,"void object_suite::fail_one_mismatched()",local_198,&local_19c);
  local_19e[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_19f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x38f,"void object_suite::fail_one_mismatched()",local_19e,&local_19f);
  local_1a4 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1a8 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x390,"void object_suite::fail_one_mismatched()",&local_1a4,&local_1a8);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
            (&local_1d0,(basic_reader<char> *)local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("reader.value<std::string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x391,"void object_suite::fail_one_mismatched()",&local_1d0,"alpha");
  std::__cxx11::string::~string((string *)&local_1d0);
  local_1e0[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_1e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x392,"void object_suite::fail_one_mismatched()",local_1e0,&local_1e4);
  local_1e6[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1e7 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x393,"void object_suite::fail_one_mismatched()",local_1e6,&local_1e7);
  local_1ec = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1f0 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x394,"void object_suite::fail_one_mismatched()",&local_1ec,&local_1f0);
  local_1f8[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_160);
  local_1fc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x395,"void object_suite::fail_one_mismatched()",local_1f8,&local_1fc);
  local_208 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_20c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x396,"void object_suite::fail_one_mismatched()",&local_208,&local_20c);
  local_20e[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_20f = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x397,"void object_suite::fail_one_mismatched()",local_20e,&local_20f);
  local_214 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_218 = 0xfffffff8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_expected_end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x398,"void object_suite::fail_one_mismatched()",&local_214,&local_218);
  eVar1 = trial::protocol::json::basic_reader<char>::error((basic_reader<char> *)local_160);
  local_228 = eVar1._M_cat;
  local_230[0] = eVar1._M_value;
  local_234 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
            ("reader.error()","json::expected_end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x399,"void object_suite::fail_one_mismatched()",local_230,&local_234);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void fail_one_mismatched()
{
    const char input[] = "{\"alpha\":1]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_expected_end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::expected_end_object);
}